

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::compress_block(IZDeflate *this,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int length;
  ulong uVar4;
  uint length_00;
  uint value;
  ulong uVar5;
  byte bVar6;
  uint local_38;
  uint local_34;
  
  if (this->last_lit != 0) {
    uVar5 = 0;
    local_38 = 0;
    local_34 = 0;
    bVar6 = 0;
    do {
      if ((uVar5 & 7) == 0) {
        uVar4 = (ulong)local_34;
        local_34 = local_34 + 1;
        bVar6 = this->flag_buf[uVar4];
      }
      bVar1 = this->l_buf[uVar5];
      if ((bVar6 & 1) == 0) {
        value = (uint)ltree[bVar1].fc.freq;
        length_00 = (uint)ltree[bVar1].dl.dad;
LAB_00128afd:
        send_bits(this,value,length_00);
      }
      else {
        bVar2 = this->length_code[bVar1];
        uVar4 = (ulong)((uint)bVar2 * 4);
        send_bits(this,(uint)*(ushort *)((long)&ltree[0x101].fc + uVar4),
                  (uint)*(ushort *)((long)&ltree[0x101].dl + uVar4));
        length = *(int *)((long)this->extra_lbits + uVar4);
        if (length != 0) {
          send_bits(this,(uint)bVar1 - this->base_length[bVar2],length);
        }
        uVar4 = (ulong)local_38;
        local_38 = local_38 + 1;
        uVar3 = this->d_buf[uVar4];
        uVar4 = (ulong)uVar3;
        if (0xff < uVar3) {
          uVar4 = (ulong)(uVar3 >> 7) + 0x100;
        }
        bVar1 = this->dist_code[uVar4];
        uVar4 = (ulong)((uint)bVar1 * 4);
        send_bits(this,(uint)*(ushort *)((long)&dtree->fc + uVar4),
                  (uint)*(ushort *)((long)&dtree->dl + uVar4));
        length_00 = *(uint *)((long)this->extra_dbits + uVar4);
        if (length_00 != 0) {
          value = (uint)uVar3 - this->base_dist[bVar1];
          goto LAB_00128afd;
        }
      }
      uVar5 = uVar5 + 1;
      bVar6 = bVar6 >> 1;
    } while (uVar5 < this->last_lit);
  }
  send_bits(this,(uint)ltree[0x100].fc.freq,(uint)ltree[0x100].dl.dad);
  return;
}

Assistant:

void IZDeflate::compress_block(ct_data near *ltree, ct_data near *dtree)
    // ct_data near *ltree; /* literal tree */
    // ct_data near *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned lx = 0;    /* running index in l_buf */
    unsigned dx = 0;    /* running index in d_buf */
    unsigned fx = 0;    /* running index in flag_buf */
    uch flag = 0;       /* current flags */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (last_lit != 0) do {
        if ((lx & 7) == 0) flag = flag_buf[fx++];
        lc = l_buf[lx++];
        if ((flag & 1) == 0) {
            send_code(lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = length_code[lc];
            send_code(code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(lc, extra);        /* send the extra length bits */
            }
            dist = d_buf[dx++];
            /* Here, dist is the match distance - 1 */
            code = d_code(dist);
            Assert(code < D_CODES, "bad d_code");

            send_code(code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= base_dist[code];
                send_bits(dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */
        flag >>= 1;
    } while (lx < last_lit);

    send_code(END_BLOCK, ltree);
}